

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_color_value(char **begin,char *end,color_t *color)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  undefined1 local_40 [4];
  int length;
  plutovg_color_t value;
  char *it;
  color_t *color_local;
  char *end_local;
  char **begin_local;
  
  value._8_8_ = *begin;
  _Var1 = skip_string((char **)&value.b,end,"currentColor");
  if (_Var1) {
    color->type = color_type_current;
    color->value = 0xff000000;
  }
  else {
    iVar2 = plutovg_color_parse((plutovg_color_t *)local_40,(char *)value._8_8_,
                                (int)end - (int)value.b);
    if (iVar2 == 0) {
      return false;
    }
    color->type = color_type_fixed;
    uVar3 = plutovg_color_to_argb32((plutovg_color_t *)local_40);
    color->value = uVar3;
    value._8_8_ = value._8_8_ + (long)iVar2;
  }
  *begin = (char *)value._8_8_;
  skip_ws(begin,end);
  return true;
}

Assistant:

static bool parse_color_value(const char** begin, const char* end, color_t* color)
{
    const char* it = *begin;
    if(skip_string(&it, end, "currentColor")) {
        color->type = color_type_current;
        color->value = 0xFF000000;
    } else {
        plutovg_color_t value;
        int length = plutovg_color_parse(&value, it, end - it);
        if(length == 0)
            return false;
        color->type = color_type_fixed;
        color->value = plutovg_color_to_argb32(&value);
        it += length;
    }

    *begin = it;
    skip_ws(begin, end);
    return true;
}